

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_sshl_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = desc * 8 & 0xff;
  uVar4 = (ulong)(uVar7 + 8);
  uVar8 = 0;
  do {
    bVar1 = *(byte *)((long)vm + uVar8);
    if ((char)bVar1 < '\0') {
      bVar6 = -bVar1;
      if (bVar1 < 0xf9) {
        bVar6 = 7;
      }
      cVar5 = (char)((int)*(char *)((long)vn + uVar8) >> (bVar6 & 0x1f));
    }
    else if (bVar1 < 8) {
      cVar5 = *(char *)((long)vn + uVar8) << (bVar1 & 0x1f);
    }
    else {
      cVar5 = '\0';
    }
    *(char *)((long)vd + uVar8) = cVar5;
    uVar8 = uVar8 + 1;
  } while (uVar4 != uVar8);
  uVar2 = desc >> 2 & 0xf8;
  if (uVar7 < uVar2) {
    uVar3 = (ulong)(uVar2 + 8);
    uVar8 = uVar4 + 8;
    if (uVar4 + 8 < uVar3) {
      uVar8 = uVar3;
    }
    memset((void *)((long)vd + uVar4),0,(~uVar4 + uVar8 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sshl_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    int8_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz; ++i) {
        int8_t mm = m[i];
        int8_t nn = n[i];
        int8_t res = 0;
        if (mm >= 0) {
            if (mm < 8) {
                res = nn << mm;
            }
        } else {
            res = nn >> (mm > -8 ? -mm : 7);
        }
        d[i] = res;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}